

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O1

bool __thiscall
MetricsDiscovery::MDHelper::FindMetricSetForDevice
          (MDHelper *this,IMetricsDeviceLatest *pMetricsDevice,string *metricSetSymbolName)

{
  int iVar1;
  long lVar2;
  IConcurrentGroupLatest *pIVar3;
  long lVar4;
  IMetricSetLatest *pIVar5;
  long lVar6;
  uint32_t cg;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  lVar2 = (**(code **)(*(long *)pMetricsDevice + 0x10))(pMetricsDevice);
  uVar7 = 0;
  uVar8 = uVar7;
  if (lVar2 != 0) {
    uVar8 = 0;
    do {
      if (*(uint *)(lVar2 + 0xc) <= uVar7) {
        uVar8 = 0;
        break;
      }
      pIVar3 = (IConcurrentGroupLatest *)
               (**(code **)(*(long *)pMetricsDevice + 0x18))(pMetricsDevice,uVar7);
      lVar4 = (**(code **)(*(long *)pIVar3 + 0x10))(pIVar3);
      if ((lVar4 != 0) && (uVar8 == 0)) {
        uVar9 = 0;
        do {
          if (*(uint *)(lVar4 + 0x14) <= uVar9) break;
          pIVar5 = (IMetricSetLatest *)(**(code **)(*(long *)pIVar3 + 0x18))(pIVar3,uVar9);
          lVar6 = (**(code **)(*(long *)pIVar5 + 0x10))(pIVar5);
          if ((((lVar6 != 0) && ((*(uint *)(lVar6 + 0x10) & this->m_APIMask) != 0)) &&
              ((*(uint *)(lVar6 + 0x14) & this->m_CategoryMask) != 0)) &&
             (iVar1 = std::__cxx11::string::compare((char *)metricSetSymbolName), iVar1 == 0)) {
            this->m_ConcurrentGroup = pIVar3;
            this->m_MetricSet = pIVar5;
            uVar8 = 1;
          }
          uVar9 = uVar9 + 1;
        } while (uVar8 == 0);
      }
      uVar7 = uVar7 + 1;
    } while (uVar8 == 0);
  }
  return SUB41(uVar8,0);
}

Assistant:

bool MDHelper::FindMetricSetForDevice(
    IMetricsDeviceLatest* pMetricsDevice,
    const std::string& metricSetSymbolName )
{
    DebugPrint("Looking for MetricSet: %s, API: %X, Category: %X\n",
        metricSetSymbolName.c_str(),
        m_APIMask,
        m_CategoryMask );

    TMetricsDeviceParamsLatest* pDeviceParams = pMetricsDevice->GetParams();
    if (NULL == pDeviceParams)
    {
        DebugPrint("MetricsDevice->GetParams returned NULL\n");
        return false;
    }

    bool found = false;
    for( uint32_t cg = 0; !found && cg < pDeviceParams->ConcurrentGroupsCount; cg++ )
    {
        IConcurrentGroupLatest *pGroup = pMetricsDevice->GetConcurrentGroup(cg);
        TConcurrentGroupParamsLatest* pGroupParams = pGroup->GetParams();

        if (NULL == pGroupParams)
        {
            continue;
        }

        for( uint32_t ms = 0; !found && ms < pGroupParams->MetricSetsCount; ms++)
        {
            IMetricSetLatest* pMetricSet = pGroup->GetMetricSet(ms);
            TMetricSetParamsLatest* pSetParams = pMetricSet->GetParams();

            if( pSetParams &&
                ( pSetParams->ApiMask & m_APIMask ) &&
                ( pSetParams->CategoryMask & m_CategoryMask ) &&
                ( metricSetSymbolName == pSetParams->SymbolName ) )
            {
                DebugPrint("Matched Group: %s MetricSet: %s MetricCount: %d API: %X, Category: %X\n",
                    pGroupParams->SymbolName,
                    pSetParams->SymbolName,
                    pSetParams->MetricsCount,
                    pSetParams->ApiMask,
                    pSetParams->CategoryMask );

                found = true;
                m_ConcurrentGroup = pGroup;
                m_MetricSet = pMetricSet;
            }
            else if( pSetParams )
            {
                DebugPrint("Skipped Group: %s MetricSet: %s MetricCount: %d API: %X, Category: %X\n",
                    pGroupParams->SymbolName,
                    pSetParams->SymbolName,
                    pSetParams->MetricsCount,
                    pSetParams->ApiMask,
                    pSetParams->CategoryMask );
            }
        }
    }

    if (m_MetricSet == NULL)
    {
        DebugPrint("MetricSet not found.\n");
    }

    return found;
}